

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

ssize_t cf_h2_recv(Curl_cfilter *cf,Curl_easy *data,char *buf,size_t len,CURLcode *err)

{
  uint uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  CURLcode CVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  size_t sVar8;
  stream_ctx *local_80;
  size_t local_78;
  size_t data_consumed;
  cf_call_data save;
  ulong uStack_60;
  CURLcode result;
  ssize_t nread;
  stream_ctx *stream;
  cf_h2_ctx *ctx;
  CURLcode *err_local;
  size_t len_local;
  char *buf_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  puVar2 = (undefined8 *)cf->ctx;
  if ((data == (Curl_easy *)0x0) || ((data->req).p.file == (FILEPROTO *)0x0)) {
    local_80 = (stream_ctx *)0x0;
  }
  else {
    local_80 = (stream_ctx *)((data->req).p.http)->h2_ctx;
  }
  if (local_80 == (stream_ctx *)0x0) {
    Curl_failf(data,"[%zd-%zd], http/2 recv on a transfer never opened or already cleared",data->id,
               cf->conn->connection_id);
    *err = CURLE_HTTP2;
    return -1;
  }
  uVar3 = *(undefined8 *)((long)cf->ctx + 0x10);
  *(Curl_easy **)((long)cf->ctx + 0x10) = data;
  uStack_60 = stream_recv(cf,data,local_80,buf,len,err);
  if ((-1 < (long)uStack_60) || (*err == CURLE_AGAIN)) {
    if ((long)uStack_60 < 0) {
      CVar4 = h2_progress_ingress(cf,data);
      *err = CVar4;
      if (*err != CURLE_OK) goto LAB_001699fd;
      uStack_60 = stream_recv(cf,data,local_80,buf,len,err);
    }
    if (0 < (long)uStack_60) {
      local_78 = uStack_60;
      if (local_80->resp_hds_len < uStack_60) {
        if (local_80->resp_hds_len != 0) {
          local_78 = uStack_60 - local_80->resp_hds_len;
          local_80->resp_hds_len = 0;
        }
        if (local_78 != 0) {
          nghttp2_session_consume((nghttp2_session *)*puVar2,local_80->id,local_78);
        }
      }
      else {
        local_80->resp_hds_len = local_80->resp_hds_len - uStack_60;
      }
      if ((local_80->closed & 1U) != 0) {
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
            && (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"[%d] DRAIN closed stream",(ulong)(uint)local_80->id);
        }
        drain_stream(cf,data,local_80);
      }
    }
  }
LAB_001699fd:
  CVar4 = h2_progress_egress(cf,data);
  if (CVar4 == CURLE_AGAIN) {
    drain_stream(cf,data,local_80);
  }
  else if (CVar4 != CURLE_OK) {
    *err = CVar4;
    uStack_60 = 0xffffffffffffffff;
  }
  if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
     ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
    uVar1 = local_80->id;
    CVar4 = *err;
    sVar8 = Curl_bufq_len(&local_80->recvbuf);
    iVar5 = nghttp2_session_get_stream_effective_recv_data_length
                      ((nghttp2_session *)*puVar2,local_80->id);
    iVar6 = nghttp2_session_get_stream_effective_local_window_size
                      ((nghttp2_session *)*puVar2,local_80->id);
    iVar7 = nghttp2_session_get_local_window_size((nghttp2_session *)*puVar2);
    Curl_trc_cf_infof(data,cf,
                      "[%d] cf_recv(len=%zu) -> %zd %d, buffered=%zu, window=%d/%d, connection %d/%d"
                      ,(ulong)uVar1,len,uStack_60,CVar4,sVar8,iVar5,iVar6,iVar7,0x3e800000);
  }
  *(undefined8 *)((long)cf->ctx + 0x10) = uVar3;
  return uStack_60;
}

Assistant:

static ssize_t cf_h2_recv(struct Curl_cfilter *cf, struct Curl_easy *data,
                          char *buf, size_t len, CURLcode *err)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);
  ssize_t nread = -1;
  CURLcode result;
  struct cf_call_data save;

  if(!stream) {
    /* Abnormal call sequence: either this transfer has never opened a stream
     * (unlikely) or the transfer has been done, cleaned up its resources, but
     * a read() is called anyway. It is not clear what the calling sequence
     * is for such a case. */
    failf(data, "[%zd-%zd], http/2 recv on a transfer never opened "
          "or already cleared", (ssize_t)data->id,
          (ssize_t)cf->conn->connection_id);
    *err = CURLE_HTTP2;
    return -1;
  }

  CF_DATA_SAVE(save, cf, data);

  nread = stream_recv(cf, data, stream, buf, len, err);
  if(nread < 0 && *err != CURLE_AGAIN)
    goto out;

  if(nread < 0) {
    *err = h2_progress_ingress(cf, data);
    if(*err)
      goto out;

    nread = stream_recv(cf, data, stream, buf, len, err);
  }

  if(nread > 0) {
    size_t data_consumed = (size_t)nread;
    /* Now that we transferred this to the upper layer, we report
     * the actual amount of DATA consumed to the H2 session, so
     * that it adjusts stream flow control */
    if(stream->resp_hds_len >= data_consumed) {
      stream->resp_hds_len -= data_consumed;  /* no DATA */
    }
    else {
      if(stream->resp_hds_len) {
        data_consumed -= stream->resp_hds_len;
        stream->resp_hds_len = 0;
      }
      if(data_consumed) {
        nghttp2_session_consume(ctx->h2, stream->id, data_consumed);
      }
    }

    if(stream->closed) {
      CURL_TRC_CF(data, cf, "[%d] DRAIN closed stream", stream->id);
      drain_stream(cf, data, stream);
    }
  }

out:
  result = h2_progress_egress(cf, data);
  if(result == CURLE_AGAIN) {
    /* pending data to send, need to be called again. Ideally, we'd
     * monitor the socket for POLLOUT, but we might not be in SENDING
     * transfer state any longer and are unable to make this happen.
     */
    drain_stream(cf, data, stream);
  }
  else if(result) {
    *err = result;
    nread = -1;
  }
  CURL_TRC_CF(data, cf, "[%d] cf_recv(len=%zu) -> %zd %d, "
              "buffered=%zu, window=%d/%d, connection %d/%d",
              stream->id, len, nread, *err,
              Curl_bufq_len(&stream->recvbuf),
              nghttp2_session_get_stream_effective_recv_data_length(
                ctx->h2, stream->id),
              nghttp2_session_get_stream_effective_local_window_size(
                ctx->h2, stream->id),
              nghttp2_session_get_local_window_size(ctx->h2),
              HTTP2_HUGE_WINDOW_SIZE);

  CF_DATA_RESTORE(cf, save);
  return nread;
}